

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_bytes(uint64_t *out1,uint8_t *arg1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  
  bVar1 = arg1[0x1f];
  bVar2 = arg1[0x1e];
  bVar3 = arg1[0x1d];
  bVar4 = arg1[0x1c];
  bVar5 = arg1[0x1b];
  bVar6 = arg1[0x1a];
  bVar7 = arg1[0x19];
  bVar8 = arg1[0x18];
  bVar9 = arg1[0x17];
  bVar10 = arg1[0x16];
  bVar11 = arg1[0x15];
  bVar12 = arg1[0x14];
  bVar13 = arg1[0x13];
  bVar14 = arg1[0x12];
  bVar15 = arg1[0x11];
  bVar16 = arg1[0x10];
  bVar17 = arg1[0xf];
  bVar18 = arg1[0xe];
  bVar19 = arg1[0xd];
  bVar20 = arg1[0xc];
  bVar21 = arg1[0xb];
  bVar22 = arg1[10];
  bVar23 = arg1[9];
  bVar24 = arg1[8];
  *out1 = ((ulong)*arg1 |
           (ulong)arg1[2] << 0x10 |
           (ulong)arg1[3] << 0x18 | (ulong)arg1[4] << 0x20 | (ulong)arg1[5] << 0x28 |
          (ulong)arg1[1] << 8) + ((ulong)arg1[6] << 0x30 | (ulong)arg1[7] << 0x38);
  out1[1] = ((ulong)bVar24 |
             (ulong)bVar22 << 0x10 |
             (ulong)bVar21 << 0x18 | (ulong)bVar20 << 0x20 | (ulong)bVar19 << 0x28 |
            (ulong)bVar23 << 8) + ((ulong)bVar18 << 0x30 | (ulong)bVar17 << 0x38);
  out1[2] = ((ulong)bVar16 |
             (ulong)bVar14 << 0x10 |
             (ulong)bVar13 << 0x18 | (ulong)bVar12 << 0x20 | (ulong)bVar11 << 0x28 |
            (ulong)bVar15 << 8) + ((ulong)bVar10 << 0x30 | (ulong)bVar9 << 0x38);
  out1[3] = ((ulong)bVar8 |
             (ulong)bVar6 << 0x10 |
             (ulong)bVar5 << 0x18 | (ulong)bVar4 << 0x20 | (ulong)bVar3 << 0x28 | (ulong)bVar7 << 8)
            + ((ulong)bVar2 << 0x30 | (ulong)bVar1 << 0x38);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_from_bytes(
    uint64_t out1[4], const uint8_t arg1[32]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint8_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint8_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint8_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    uint64_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    x1 = ((uint64_t)(arg1[31]) << 56);
    x2 = ((uint64_t)(arg1[30]) << 48);
    x3 = ((uint64_t)(arg1[29]) << 40);
    x4 = ((uint64_t)(arg1[28]) << 32);
    x5 = ((uint64_t)(arg1[27]) << 24);
    x6 = ((uint64_t)(arg1[26]) << 16);
    x7 = ((uint64_t)(arg1[25]) << 8);
    x8 = (arg1[24]);
    x9 = ((uint64_t)(arg1[23]) << 56);
    x10 = ((uint64_t)(arg1[22]) << 48);
    x11 = ((uint64_t)(arg1[21]) << 40);
    x12 = ((uint64_t)(arg1[20]) << 32);
    x13 = ((uint64_t)(arg1[19]) << 24);
    x14 = ((uint64_t)(arg1[18]) << 16);
    x15 = ((uint64_t)(arg1[17]) << 8);
    x16 = (arg1[16]);
    x17 = ((uint64_t)(arg1[15]) << 56);
    x18 = ((uint64_t)(arg1[14]) << 48);
    x19 = ((uint64_t)(arg1[13]) << 40);
    x20 = ((uint64_t)(arg1[12]) << 32);
    x21 = ((uint64_t)(arg1[11]) << 24);
    x22 = ((uint64_t)(arg1[10]) << 16);
    x23 = ((uint64_t)(arg1[9]) << 8);
    x24 = (arg1[8]);
    x25 = ((uint64_t)(arg1[7]) << 56);
    x26 = ((uint64_t)(arg1[6]) << 48);
    x27 = ((uint64_t)(arg1[5]) << 40);
    x28 = ((uint64_t)(arg1[4]) << 32);
    x29 = ((uint64_t)(arg1[3]) << 24);
    x30 = ((uint64_t)(arg1[2]) << 16);
    x31 = ((uint64_t)(arg1[1]) << 8);
    x32 = (arg1[0]);
    x33 = (x31 + (uint64_t)x32);
    x34 = (x30 + x33);
    x35 = (x29 + x34);
    x36 = (x28 + x35);
    x37 = (x27 + x36);
    x38 = (x26 + x37);
    x39 = (x25 + x38);
    x40 = (x23 + (uint64_t)x24);
    x41 = (x22 + x40);
    x42 = (x21 + x41);
    x43 = (x20 + x42);
    x44 = (x19 + x43);
    x45 = (x18 + x44);
    x46 = (x17 + x45);
    x47 = (x15 + (uint64_t)x16);
    x48 = (x14 + x47);
    x49 = (x13 + x48);
    x50 = (x12 + x49);
    x51 = (x11 + x50);
    x52 = (x10 + x51);
    x53 = (x9 + x52);
    x54 = (x7 + (uint64_t)x8);
    x55 = (x6 + x54);
    x56 = (x5 + x55);
    x57 = (x4 + x56);
    x58 = (x3 + x57);
    x59 = (x2 + x58);
    x60 = (x1 + x59);
    out1[0] = x39;
    out1[1] = x46;
    out1[2] = x53;
    out1[3] = x60;
}